

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoint.cpp
# Opt level: O0

void __thiscall Liby::Endpoint::Endpoint(Endpoint *this,string *addr,string *port)

{
  int iVar1;
  string *port_local;
  string *addr_local;
  Endpoint *this_local;
  
  iVar1 = std::__cxx11::stoi(port,(size_t *)0x0,10);
  Endpoint(this,addr,(uint16_t)iVar1);
  return;
}

Assistant:

Endpoint::Endpoint(const std::string &addr, const std::string &port)
    : Endpoint(addr, static_cast<uint16_t>(std::stoi(port))) {}